

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O2

int integers_equal(CBS *bytes,BIGNUM *bn)

{
  int iVar1;
  CBS copy;
  uint8_t buf [66];
  
  copy.data = bytes->data;
  copy.len = bytes->len;
  do {
    if (copy.len == 0) {
LAB_003e8a3a:
      iVar1 = BN_bn2bin_padded(buf,copy.len,bn);
      if (iVar1 == 0) {
        ERR_clear_error();
        iVar1 = 0;
      }
      else {
        iVar1 = CBS_mem_equal(&copy,buf,copy.len);
      }
      return iVar1;
    }
    if (*copy.data != '\0') {
      if (0x42 < copy.len) {
        return 0;
      }
      goto LAB_003e8a3a;
    }
    CBS_skip(&copy,1);
  } while( true );
}

Assistant:

static int integers_equal(const CBS *bytes, const BIGNUM *bn) {
  // Although, in SEC 1, Field-Element-to-Octet-String has a fixed width,
  // OpenSSL mis-encodes the |a| and |b|, so we tolerate any number of leading
  // zeros. (This matters for P-521 whose |b| has a leading 0.)
  CBS copy = *bytes;
  while (CBS_len(&copy) > 0 && CBS_data(&copy)[0] == 0) {
    CBS_skip(&copy, 1);
  }

  if (CBS_len(&copy) > EC_MAX_BYTES) {
    return 0;
  }
  uint8_t buf[EC_MAX_BYTES];
  if (!BN_bn2bin_padded(buf, CBS_len(&copy), bn)) {
    ERR_clear_error();
    return 0;
  }

  return CBS_mem_equal(&copy, buf, CBS_len(&copy));
}